

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * __thiscall llvm::MallocAllocator::Allocate(MallocAllocator *this,size_t Size,size_t param_2)

{
  void *pvVar1;
  size_t param_2_local;
  size_t Size_local;
  MallocAllocator *this_local;
  
  pvVar1 = safe_malloc(Size);
  return pvVar1;
}

Assistant:

LLVM_ATTRIBUTE_RETURNS_NONNULL void *Allocate(size_t Size,
                                                size_t /*Alignment*/) {
    return safe_malloc(Size);
  }